

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# pm_matrix_tests.h
# Opt level: O1

void test_barcode<Gudhi::persistence_matrix::Matrix<Boundary_options<true,(Gudhi::persistence_matrix::Column_types)7,false,false,true>>>
               (void)

{
  uint *__args_2;
  pointer puVar1;
  _Base_ptr p_Var2;
  bool bVar3;
  _Rb_tree_node_base *p_Var4;
  undefined1 *puVar5;
  pointer __args;
  undefined4 local_4fc;
  undefined4 *local_4f8;
  _Base_ptr local_4f0;
  undefined **local_4e8;
  ulong local_4e0;
  shared_count sStack_4d8;
  undefined4 **local_4d0;
  undefined8 local_4c8;
  uint local_4c0 [2];
  undefined8 *local_4b8;
  _Base_ptr *local_4b0;
  undefined1 local_4a8 [8];
  undefined8 local_4a0;
  shared_count sStack_498;
  char *local_490;
  char *local_488;
  undefined **local_480;
  char *local_478;
  undefined8 *local_470;
  char *local_468;
  set<std::tuple<int,_int,_int>,_BarComp,_std::allocator<std::tuple<int,_int,_int>_>_> bars1;
  vector<std::vector<unsigned_int,_std::allocator<unsigned_int>_>,_std::allocator<std::vector<unsigned_int,_std::allocator<unsigned_int>_>_>_>
  columns;
  set<std::tuple<int,_int,_int>,_BarComp,_std::allocator<std::tuple<int,_int,_int>_>_> bars3;
  set<std::tuple<int,_int,_int>,_BarComp,_std::allocator<std::tuple<int,_int,_int>_>_> bars2;
  char *local_398;
  char *local_390;
  char *local_388;
  char *local_380;
  undefined1 *local_378;
  undefined1 *local_370;
  char *local_368;
  char *local_360;
  char *local_358;
  char *local_350;
  undefined1 *local_348;
  undefined1 *local_340;
  char *local_338;
  char *local_330;
  undefined1 *local_328;
  undefined1 *local_320;
  char *local_318;
  char *local_310;
  undefined1 *local_308;
  undefined1 *local_300;
  char *local_2f8;
  char *local_2f0;
  undefined1 *local_2e8;
  undefined1 *local_2e0;
  char *local_2d8;
  char *local_2d0;
  undefined1 *local_2c8;
  undefined1 *local_2c0;
  char *local_2b8;
  char *local_2b0;
  undefined1 *local_2a8;
  undefined1 *local_2a0;
  char *local_298;
  char *local_290;
  undefined1 *local_288;
  undefined1 *local_280;
  char *local_278;
  char *local_270;
  undefined1 *local_268;
  undefined1 *local_260;
  char *local_258;
  char *local_250;
  undefined1 *local_248;
  undefined1 *local_240;
  char *local_238;
  char *local_230;
  undefined1 *local_228;
  undefined1 *local_220;
  char *local_218;
  char *local_210;
  undefined1 *local_208;
  undefined1 *local_200;
  char *local_1f8;
  char *local_1f0;
  undefined1 *local_1e8;
  undefined1 *local_1e0;
  char *local_1d8;
  char *local_1d0;
  undefined1 *local_1c8;
  undefined1 *local_1c0;
  char *local_1b8;
  char *local_1b0;
  undefined1 *local_1a8;
  undefined1 *local_1a0;
  char *local_198;
  char *local_190;
  undefined1 *local_188;
  undefined1 *local_180;
  char *local_178;
  char *local_170;
  undefined1 *local_168;
  undefined1 *local_160;
  char *local_158;
  char *local_150;
  Matrix<Boundary_options<true,_(Gudhi::persistence_matrix::Column_types)7,_false,_false,_true>_> m;
  
  build_longer_boundary_matrix<Gudhi::persistence_matrix::Intrusive_list_column<Gudhi::persistence_matrix::Matrix<Boundary_options<true,(Gudhi::persistence_matrix::Column_types)7,false,false,true>>>>
            ();
  m.colSettings_ = (Column_settings *)operator_new(0x38);
  ((m.colSettings_)->entryConstructor).entryPool_.
  super_pool<boost::default_user_allocator_malloc_free>.
  super_simple_segregated_storage<unsigned_long>.first = (void *)0x0;
  ((m.colSettings_)->entryConstructor).entryPool_.
  super_pool<boost::default_user_allocator_malloc_free>.list.ptr = (char *)0x0;
  ((m.colSettings_)->entryConstructor).entryPool_.
  super_pool<boost::default_user_allocator_malloc_free>.list.sz = 0;
  ((m.colSettings_)->entryConstructor).entryPool_.
  super_pool<boost::default_user_allocator_malloc_free>.requested_size = 0x18;
  ((m.colSettings_)->entryConstructor).entryPool_.
  super_pool<boost::default_user_allocator_malloc_free>.next_size = 0x20;
  ((m.colSettings_)->entryConstructor).entryPool_.
  super_pool<boost::default_user_allocator_malloc_free>.start_size = 0x20;
  ((m.colSettings_)->entryConstructor).entryPool_.
  super_pool<boost::default_user_allocator_malloc_free>.max_size = 0;
  Gudhi::persistence_matrix::
  Boundary_matrix<Gudhi::persistence_matrix::Matrix<Boundary_options<true,(Gudhi::persistence_matrix::Column_types)7,false,false,true>>>
  ::Boundary_matrix<std::vector<unsigned_int,std::allocator<unsigned_int>>>
            ((Boundary_matrix<Gudhi::persistence_matrix::Matrix<Boundary_options<true,(Gudhi::persistence_matrix::Column_types)7,false,false,true>>>
              *)&m.matrix_,&columns,m.colSettings_);
  if (m.matrix_.super_Base_pairing_option.isReduced_ == false) {
    Gudhi::persistence_matrix::
    Base_pairing<Gudhi::persistence_matrix::Matrix<Boundary_options<true,_(Gudhi::persistence_matrix::Column_types)7,_false,_false,_true>_>_>
    ::_reduce(&m.matrix_.super_Base_pairing_option);
  }
  puVar1 = columns.
           super__Vector_base<std::vector<unsigned_int,_std::allocator<unsigned_int>_>,_std::allocator<std::vector<unsigned_int,_std::allocator<unsigned_int>_>_>_>
           ._M_impl.super__Vector_impl_data._M_start[5].
           super__Vector_base<unsigned_int,_std::allocator<unsigned_int>_>._M_impl.
           super__Vector_impl_data._M_start;
  if (columns.
      super__Vector_base<std::vector<unsigned_int,_std::allocator<unsigned_int>_>,_std::allocator<std::vector<unsigned_int,_std::allocator<unsigned_int>_>_>_>
      ._M_impl.super__Vector_impl_data._M_start[5].
      super__Vector_base<unsigned_int,_std::allocator<unsigned_int>_>._M_impl.
      super__Vector_impl_data._M_finish != puVar1) {
    columns.
    super__Vector_base<std::vector<unsigned_int,_std::allocator<unsigned_int>_>,_std::allocator<std::vector<unsigned_int,_std::allocator<unsigned_int>_>_>_>
    ._M_impl.super__Vector_impl_data._M_start[5].
    super__Vector_base<unsigned_int,_std::allocator<unsigned_int>_>._M_impl.super__Vector_impl_data.
    _M_finish = puVar1;
  }
  test_content_equality<Gudhi::persistence_matrix::Matrix<Boundary_options<true,(Gudhi::persistence_matrix::Column_types)7,false,false,true>>>
            (&columns,&m);
  bars1._M_t._M_impl.super__Rb_tree_header._M_header._M_left =
       &bars1._M_t._M_impl.super__Rb_tree_header._M_header;
  bars1._M_t._M_impl.super__Rb_tree_header._M_header._M_color = _S_red;
  bars1._M_t._M_impl.super__Rb_tree_header._M_header._M_parent = (_Base_ptr)0x0;
  bars1._M_t._M_impl.super__Rb_tree_header._M_node_count = 0;
  bars2._M_t._M_impl.super__Rb_tree_header._M_header._M_left =
       &bars2._M_t._M_impl.super__Rb_tree_header._M_header;
  bars2._M_t._M_impl.super__Rb_tree_header._M_header._M_color = _S_red;
  bars2._M_t._M_impl.super__Rb_tree_header._M_header._M_parent = (_Base_ptr)0x0;
  bars2._M_t._M_impl.super__Rb_tree_header._M_node_count = 0;
  bars3._M_t._M_impl.super__Rb_tree_header._M_header._M_left =
       &bars3._M_t._M_impl.super__Rb_tree_header._M_header;
  bars3._M_t._M_impl.super__Rb_tree_header._M_header._M_color = _S_red;
  bars3._M_t._M_impl.super__Rb_tree_header._M_header._M_parent = (_Base_ptr)0x0;
  bars3._M_t._M_impl.super__Rb_tree_header._M_node_count = 0;
  bars1._M_t._M_impl.super__Rb_tree_header._M_header._M_right =
       bars1._M_t._M_impl.super__Rb_tree_header._M_header._M_left;
  bars3._M_t._M_impl.super__Rb_tree_header._M_header._M_right =
       bars3._M_t._M_impl.super__Rb_tree_header._M_header._M_left;
  bars2._M_t._M_impl.super__Rb_tree_header._M_header._M_right =
       bars2._M_t._M_impl.super__Rb_tree_header._M_header._M_left;
  if (m.matrix_.super_Base_pairing_option.barcode_.
      super__Vector_base<Gudhi::persistence_matrix::Persistence_interval<int,_unsigned_int>,_std::allocator<Gudhi::persistence_matrix::Persistence_interval<int,_unsigned_int>_>_>
      ._M_impl.super__Vector_impl_data._M_start !=
      m.matrix_.super_Base_pairing_option.barcode_.
      super__Vector_base<Gudhi::persistence_matrix::Persistence_interval<int,_unsigned_int>,_std::allocator<Gudhi::persistence_matrix::Persistence_interval<int,_unsigned_int>_>_>
      ._M_impl.super__Vector_impl_data._M_finish) {
    __args = m.matrix_.super_Base_pairing_option.barcode_.
             super__Vector_base<Gudhi::persistence_matrix::Persistence_interval<int,_unsigned_int>,_std::allocator<Gudhi::persistence_matrix::Persistence_interval<int,_unsigned_int>_>_>
             ._M_impl.super__Vector_impl_data._M_start;
    do {
      __args_2 = &__args->death;
      std::
      _Rb_tree<std::tuple<int,int,int>,std::tuple<int,int,int>,std::_Identity<std::tuple<int,int,int>>,test_barcode<Gudhi::persistence_matrix::Matrix<Boundary_options<true,(Gudhi::persistence_matrix::Column_types)7,false,false,true>>>()::BarComp,std::allocator<std::tuple<int,int,int>>>
      ::_M_emplace_unique<int_const&,unsigned_int_const&,unsigned_int_const&>
                ((_Rb_tree<std::tuple<int,int,int>,std::tuple<int,int,int>,std::_Identity<std::tuple<int,int,int>>,test_barcode<Gudhi::persistence_matrix::Matrix<Boundary_options<true,(Gudhi::persistence_matrix::Column_types)7,false,false,true>>>()::BarComp,std::allocator<std::tuple<int,int,int>>>
                  *)&bars1,&__args->dim,&__args->birth,__args_2);
      std::
      _Rb_tree<std::tuple<int,int,int>,std::tuple<int,int,int>,std::_Identity<std::tuple<int,int,int>>,test_barcode<Gudhi::persistence_matrix::Matrix<Boundary_options<true,(Gudhi::persistence_matrix::Column_types)7,false,false,true>>>()::BarComp,std::allocator<std::tuple<int,int,int>>>
      ::_M_emplace_unique<int_const&,unsigned_int_const&,unsigned_int_const&>
                ((_Rb_tree<std::tuple<int,int,int>,std::tuple<int,int,int>,std::_Identity<std::tuple<int,int,int>>,test_barcode<Gudhi::persistence_matrix::Matrix<Boundary_options<true,(Gudhi::persistence_matrix::Column_types)7,false,false,true>>>()::BarComp,std::allocator<std::tuple<int,int,int>>>
                  *)&bars2,&__args->dim,&__args->birth,__args_2);
      local_4c0[0] = *__args_2;
      local_4c8._0_4_ = __args->dim;
      local_4c8._4_4_ = __args->birth;
      std::
      _Rb_tree<std::tuple<int,int,int>,std::tuple<int,int,int>,std::_Identity<std::tuple<int,int,int>>,test_barcode<Gudhi::persistence_matrix::Matrix<Boundary_options<true,(Gudhi::persistence_matrix::Column_types)7,false,false,true>>>()::BarComp,std::allocator<std::tuple<int,int,int>>>
      ::_M_emplace_unique<int&,unsigned_int&,unsigned_int&>
                ((_Rb_tree<std::tuple<int,int,int>,std::tuple<int,int,int>,std::_Identity<std::tuple<int,int,int>>,test_barcode<Gudhi::persistence_matrix::Matrix<Boundary_options<true,(Gudhi::persistence_matrix::Column_types)7,false,false,true>>>()::BarComp,std::allocator<std::tuple<int,int,int>>>
                  *)&bars3,(int *)&local_4c8,(uint *)((long)&local_4c8 + 4),local_4c0);
      __args = __args + 1;
    } while (__args != m.matrix_.super_Base_pairing_option.barcode_.
                       super__Vector_base<Gudhi::persistence_matrix::Persistence_interval<int,_unsigned_int>,_std::allocator<Gudhi::persistence_matrix::Persistence_interval<int,_unsigned_int>_>_>
                       ._M_impl.super__Vector_impl_data._M_finish);
  }
  p_Var2 = bars1._M_t._M_impl.super__Rb_tree_header._M_header._M_left;
  local_158 = 
  "/workspace/llm4binary/github/license_c_cmakelists/GUDHI[P]gudhi-devel/src/Persistence_matrix/test/pm_matrix_tests.h"
  ;
  local_150 = "";
  local_168 = &boost::unit_test::basic_cstring<char_const>::null;
  local_160 = &boost::unit_test::basic_cstring<char_const>::null;
  boost::unit_test::unit_test_log_t::set_checkpoint
            (boost::unit_test::(anonymous_namespace)::unit_test_log,&local_158,0x574);
  local_478 = (char *)((ulong)local_478 & 0xffffffffffffff00);
  local_480 = &PTR__lazy_ostream_001f2110;
  local_470 = &boost::unit_test::lazy_ostream::inst;
  local_468 = "";
  local_4f0 = (_Base_ptr)&p_Var2[1]._M_parent;
  local_4f8 = &local_4fc;
  local_4fc = 0;
  local_4a8[0] = *(int *)&p_Var2[1]._M_parent == 0;
  local_4a0 = 0;
  sStack_498.pi_ = (sp_counted_base *)0x0;
  local_490 = 
  "/workspace/llm4binary/github/license_c_cmakelists/GUDHI[P]gudhi-devel/src/Persistence_matrix/test/pm_matrix_tests.h"
  ;
  local_488 = "";
  local_4b0 = &local_4f0;
  local_4c0[0] = local_4c0[0] & 0xffffff00;
  local_4c8 = &PTR__lazy_ostream_001f20d0;
  local_4b8 = &boost::unit_test::lazy_ostream::inst;
  local_4e0 = local_4e0 & 0xffffffffffffff00;
  local_4d0 = &local_4f8;
  local_4e8 = &PTR__lazy_ostream_001f20d0;
  sStack_4d8.pi_ = (sp_counted_base *)&boost::unit_test::lazy_ostream::inst;
  boost::test_tools::tt_detail::report_assertion();
  boost::detail::shared_count::~shared_count(&sStack_498);
  local_178 = 
  "/workspace/llm4binary/github/license_c_cmakelists/GUDHI[P]gudhi-devel/src/Persistence_matrix/test/pm_matrix_tests.h"
  ;
  local_170 = "";
  local_188 = &boost::unit_test::basic_cstring<char_const>::null;
  local_180 = &boost::unit_test::basic_cstring<char_const>::null;
  boost::unit_test::unit_test_log_t::set_checkpoint
            (boost::unit_test::(anonymous_namespace)::unit_test_log,&local_178,0x575);
  local_478 = (char *)((ulong)local_478 & 0xffffffffffffff00);
  local_480 = &PTR__lazy_ostream_001f2110;
  local_470 = &boost::unit_test::lazy_ostream::inst;
  local_468 = "";
  local_4fc = 0;
  local_4a8[0] = *(int *)&p_Var2[1].field_0x4 == 0;
  local_4f0 = (_Base_ptr)&p_Var2[1].field_0x4;
  local_4a0 = 0;
  sStack_498.pi_ = (sp_counted_base *)0x0;
  local_490 = 
  "/workspace/llm4binary/github/license_c_cmakelists/GUDHI[P]gudhi-devel/src/Persistence_matrix/test/pm_matrix_tests.h"
  ;
  local_488 = "";
  local_4c0[0] = local_4c0[0] & 0xffffff00;
  local_4c8 = &PTR__lazy_ostream_001f20d0;
  local_4b8 = &boost::unit_test::lazy_ostream::inst;
  local_4b0 = &local_4f0;
  local_4f8 = &local_4fc;
  local_4e0 = local_4e0 & 0xffffffffffffff00;
  local_4e8 = &PTR__lazy_ostream_001f20d0;
  sStack_4d8.pi_ = (sp_counted_base *)&boost::unit_test::lazy_ostream::inst;
  local_4d0 = &local_4f8;
  boost::test_tools::tt_detail::report_assertion();
  boost::detail::shared_count::~shared_count(&sStack_498);
  local_198 = 
  "/workspace/llm4binary/github/license_c_cmakelists/GUDHI[P]gudhi-devel/src/Persistence_matrix/test/pm_matrix_tests.h"
  ;
  local_190 = "";
  local_1a8 = &boost::unit_test::basic_cstring<char_const>::null;
  local_1a0 = &boost::unit_test::basic_cstring<char_const>::null;
  boost::unit_test::unit_test_log_t::set_checkpoint
            (boost::unit_test::(anonymous_namespace)::unit_test_log,&local_198,0x577);
  local_4f0 = p_Var2 + 1;
  local_478 = (char *)((ulong)local_478 & 0xffffffffffffff00);
  local_480 = &PTR__lazy_ostream_001f2110;
  local_470 = &boost::unit_test::lazy_ostream::inst;
  local_468 = "";
  local_4fc = 0xffffffff;
  local_4a8[0] = local_4f0->_M_color == ~_S_red;
  local_4a0 = 0;
  sStack_498.pi_ = (sp_counted_base *)0x0;
  local_490 = 
  "/workspace/llm4binary/github/license_c_cmakelists/GUDHI[P]gudhi-devel/src/Persistence_matrix/test/pm_matrix_tests.h"
  ;
  local_488 = "";
  local_4c0[0] = local_4c0[0] & 0xffffff00;
  local_4c8 = &PTR__lazy_ostream_001f20d0;
  local_4b8 = &boost::unit_test::lazy_ostream::inst;
  local_4b0 = &local_4f0;
  local_4f8 = &local_4fc;
  local_4e0 = local_4e0 & 0xffffffffffffff00;
  local_4e8 = &PTR__lazy_ostream_001f20d0;
  sStack_4d8.pi_ = (sp_counted_base *)&boost::unit_test::lazy_ostream::inst;
  local_4d0 = &local_4f8;
  boost::test_tools::tt_detail::report_assertion();
  boost::detail::shared_count::~shared_count(&sStack_498);
  p_Var4 = (_Rb_tree_node_base *)std::_Rb_tree_increment(p_Var2);
  local_1b8 = 
  "/workspace/llm4binary/github/license_c_cmakelists/GUDHI[P]gudhi-devel/src/Persistence_matrix/test/pm_matrix_tests.h"
  ;
  local_1b0 = "";
  local_1c8 = &boost::unit_test::basic_cstring<char_const>::null;
  local_1c0 = &boost::unit_test::basic_cstring<char_const>::null;
  boost::unit_test::unit_test_log_t::set_checkpoint
            (boost::unit_test::(anonymous_namespace)::unit_test_log,&local_1b8,0x579);
  local_478 = (char *)((ulong)local_478 & 0xffffffffffffff00);
  local_480 = &PTR__lazy_ostream_001f2110;
  local_470 = &boost::unit_test::lazy_ostream::inst;
  local_468 = "";
  local_4fc = 0;
  local_4a8[0] = *(int *)&p_Var4[1]._M_parent == 0;
  local_4f0 = (_Base_ptr)&p_Var4[1]._M_parent;
  local_4a0 = 0;
  sStack_498.pi_ = (sp_counted_base *)0x0;
  local_490 = 
  "/workspace/llm4binary/github/license_c_cmakelists/GUDHI[P]gudhi-devel/src/Persistence_matrix/test/pm_matrix_tests.h"
  ;
  local_488 = "";
  local_4c0[0] = local_4c0[0] & 0xffffff00;
  local_4c8 = &PTR__lazy_ostream_001f20d0;
  local_4b8 = &boost::unit_test::lazy_ostream::inst;
  local_4b0 = &local_4f0;
  local_4f8 = &local_4fc;
  local_4e0 = local_4e0 & 0xffffffffffffff00;
  local_4e8 = &PTR__lazy_ostream_001f20d0;
  sStack_4d8.pi_ = (sp_counted_base *)&boost::unit_test::lazy_ostream::inst;
  local_4d0 = &local_4f8;
  boost::test_tools::tt_detail::report_assertion();
  boost::detail::shared_count::~shared_count(&sStack_498);
  local_1d8 = 
  "/workspace/llm4binary/github/license_c_cmakelists/GUDHI[P]gudhi-devel/src/Persistence_matrix/test/pm_matrix_tests.h"
  ;
  local_1d0 = "";
  local_1e8 = &boost::unit_test::basic_cstring<char_const>::null;
  local_1e0 = &boost::unit_test::basic_cstring<char_const>::null;
  boost::unit_test::unit_test_log_t::set_checkpoint
            (boost::unit_test::(anonymous_namespace)::unit_test_log,&local_1d8,0x57a);
  local_478 = (char *)((ulong)local_478 & 0xffffffffffffff00);
  local_480 = &PTR__lazy_ostream_001f2110;
  local_470 = &boost::unit_test::lazy_ostream::inst;
  local_468 = "";
  local_4fc = 1;
  local_4a8[0] = *(int *)&p_Var4[1].field_0x4 == 1;
  local_4f0 = (_Base_ptr)&p_Var4[1].field_0x4;
  local_4a0 = 0;
  sStack_498.pi_ = (sp_counted_base *)0x0;
  local_490 = 
  "/workspace/llm4binary/github/license_c_cmakelists/GUDHI[P]gudhi-devel/src/Persistence_matrix/test/pm_matrix_tests.h"
  ;
  local_488 = "";
  local_4c0[0] = local_4c0[0] & 0xffffff00;
  local_4c8 = &PTR__lazy_ostream_001f20d0;
  local_4b8 = &boost::unit_test::lazy_ostream::inst;
  local_4b0 = &local_4f0;
  local_4f8 = &local_4fc;
  local_4e0 = local_4e0 & 0xffffffffffffff00;
  local_4e8 = &PTR__lazy_ostream_001f20d0;
  sStack_4d8.pi_ = (sp_counted_base *)&boost::unit_test::lazy_ostream::inst;
  local_4d0 = &local_4f8;
  boost::test_tools::tt_detail::report_assertion();
  boost::detail::shared_count::~shared_count(&sStack_498);
  local_1f8 = 
  "/workspace/llm4binary/github/license_c_cmakelists/GUDHI[P]gudhi-devel/src/Persistence_matrix/test/pm_matrix_tests.h"
  ;
  local_1f0 = "";
  local_208 = &boost::unit_test::basic_cstring<char_const>::null;
  local_200 = &boost::unit_test::basic_cstring<char_const>::null;
  boost::unit_test::unit_test_log_t::set_checkpoint
            (boost::unit_test::(anonymous_namespace)::unit_test_log,&local_1f8,0x57b);
  local_4f0 = p_Var4 + 1;
  local_478 = (char *)((ulong)local_478 & 0xffffffffffffff00);
  local_480 = &PTR__lazy_ostream_001f2110;
  local_470 = &boost::unit_test::lazy_ostream::inst;
  local_468 = "";
  local_4fc = 3;
  local_4a8[0] = local_4f0->_M_color == 3;
  local_4a0 = 0;
  sStack_498.pi_ = (sp_counted_base *)0x0;
  local_490 = 
  "/workspace/llm4binary/github/license_c_cmakelists/GUDHI[P]gudhi-devel/src/Persistence_matrix/test/pm_matrix_tests.h"
  ;
  local_488 = "";
  local_4c0[0] = local_4c0[0] & 0xffffff00;
  local_4c8 = &PTR__lazy_ostream_001f20d0;
  local_4b8 = &boost::unit_test::lazy_ostream::inst;
  local_4b0 = &local_4f0;
  local_4f8 = &local_4fc;
  local_4e0 = local_4e0 & 0xffffffffffffff00;
  local_4e8 = &PTR__lazy_ostream_001f20d0;
  sStack_4d8.pi_ = (sp_counted_base *)&boost::unit_test::lazy_ostream::inst;
  local_4d0 = &local_4f8;
  boost::test_tools::tt_detail::report_assertion();
  boost::detail::shared_count::~shared_count(&sStack_498);
  p_Var4 = (_Rb_tree_node_base *)std::_Rb_tree_increment(p_Var4);
  local_218 = 
  "/workspace/llm4binary/github/license_c_cmakelists/GUDHI[P]gudhi-devel/src/Persistence_matrix/test/pm_matrix_tests.h"
  ;
  local_210 = "";
  local_228 = &boost::unit_test::basic_cstring<char_const>::null;
  local_220 = &boost::unit_test::basic_cstring<char_const>::null;
  boost::unit_test::unit_test_log_t::set_checkpoint
            (boost::unit_test::(anonymous_namespace)::unit_test_log,&local_218,0x57d);
  local_478 = (char *)((ulong)local_478 & 0xffffffffffffff00);
  local_480 = &PTR__lazy_ostream_001f2110;
  local_470 = &boost::unit_test::lazy_ostream::inst;
  local_468 = "";
  local_4fc = 0;
  local_4a8[0] = *(int *)&p_Var4[1]._M_parent == 0;
  local_4f0 = (_Base_ptr)&p_Var4[1]._M_parent;
  local_4a0 = 0;
  sStack_498.pi_ = (sp_counted_base *)0x0;
  local_490 = 
  "/workspace/llm4binary/github/license_c_cmakelists/GUDHI[P]gudhi-devel/src/Persistence_matrix/test/pm_matrix_tests.h"
  ;
  local_488 = "";
  local_4c0[0] = local_4c0[0] & 0xffffff00;
  local_4c8 = &PTR__lazy_ostream_001f20d0;
  local_4b8 = &boost::unit_test::lazy_ostream::inst;
  local_4b0 = &local_4f0;
  local_4f8 = &local_4fc;
  local_4e0 = local_4e0 & 0xffffffffffffff00;
  local_4e8 = &PTR__lazy_ostream_001f20d0;
  sStack_4d8.pi_ = (sp_counted_base *)&boost::unit_test::lazy_ostream::inst;
  local_4d0 = &local_4f8;
  boost::test_tools::tt_detail::report_assertion();
  boost::detail::shared_count::~shared_count(&sStack_498);
  local_238 = 
  "/workspace/llm4binary/github/license_c_cmakelists/GUDHI[P]gudhi-devel/src/Persistence_matrix/test/pm_matrix_tests.h"
  ;
  local_230 = "";
  local_248 = &boost::unit_test::basic_cstring<char_const>::null;
  local_240 = &boost::unit_test::basic_cstring<char_const>::null;
  boost::unit_test::unit_test_log_t::set_checkpoint
            (boost::unit_test::(anonymous_namespace)::unit_test_log,&local_238,0x57e);
  local_478 = (char *)((ulong)local_478 & 0xffffffffffffff00);
  local_480 = &PTR__lazy_ostream_001f2110;
  local_470 = &boost::unit_test::lazy_ostream::inst;
  local_468 = "";
  local_4fc = 2;
  local_4a8[0] = *(int *)&p_Var4[1].field_0x4 == 2;
  local_4f0 = (_Base_ptr)&p_Var4[1].field_0x4;
  local_4a0 = 0;
  sStack_498.pi_ = (sp_counted_base *)0x0;
  local_490 = 
  "/workspace/llm4binary/github/license_c_cmakelists/GUDHI[P]gudhi-devel/src/Persistence_matrix/test/pm_matrix_tests.h"
  ;
  local_488 = "";
  local_4c0[0] = local_4c0[0] & 0xffffff00;
  local_4c8 = &PTR__lazy_ostream_001f20d0;
  local_4b8 = &boost::unit_test::lazy_ostream::inst;
  local_4b0 = &local_4f0;
  local_4f8 = &local_4fc;
  local_4e0 = local_4e0 & 0xffffffffffffff00;
  local_4e8 = &PTR__lazy_ostream_001f20d0;
  sStack_4d8.pi_ = (sp_counted_base *)&boost::unit_test::lazy_ostream::inst;
  local_4d0 = &local_4f8;
  boost::test_tools::tt_detail::report_assertion();
  boost::detail::shared_count::~shared_count(&sStack_498);
  local_258 = 
  "/workspace/llm4binary/github/license_c_cmakelists/GUDHI[P]gudhi-devel/src/Persistence_matrix/test/pm_matrix_tests.h"
  ;
  local_250 = "";
  local_268 = &boost::unit_test::basic_cstring<char_const>::null;
  local_260 = &boost::unit_test::basic_cstring<char_const>::null;
  boost::unit_test::unit_test_log_t::set_checkpoint
            (boost::unit_test::(anonymous_namespace)::unit_test_log,&local_258,0x57f);
  local_4f0 = p_Var4 + 1;
  local_478 = (char *)((ulong)local_478 & 0xffffffffffffff00);
  local_480 = &PTR__lazy_ostream_001f2110;
  local_470 = &boost::unit_test::lazy_ostream::inst;
  local_468 = "";
  local_4fc = 4;
  local_4a8[0] = local_4f0->_M_color == 4;
  local_4a0 = 0;
  sStack_498.pi_ = (sp_counted_base *)0x0;
  local_490 = 
  "/workspace/llm4binary/github/license_c_cmakelists/GUDHI[P]gudhi-devel/src/Persistence_matrix/test/pm_matrix_tests.h"
  ;
  local_488 = "";
  local_4c0[0] = local_4c0[0] & 0xffffff00;
  local_4c8 = &PTR__lazy_ostream_001f20d0;
  local_4b8 = &boost::unit_test::lazy_ostream::inst;
  local_4b0 = &local_4f0;
  local_4f8 = &local_4fc;
  local_4e0 = local_4e0 & 0xffffffffffffff00;
  local_4e8 = &PTR__lazy_ostream_001f20d0;
  sStack_4d8.pi_ = (sp_counted_base *)&boost::unit_test::lazy_ostream::inst;
  local_4d0 = &local_4f8;
  boost::test_tools::tt_detail::report_assertion();
  boost::detail::shared_count::~shared_count(&sStack_498);
  p_Var4 = (_Rb_tree_node_base *)std::_Rb_tree_increment(p_Var4);
  local_278 = 
  "/workspace/llm4binary/github/license_c_cmakelists/GUDHI[P]gudhi-devel/src/Persistence_matrix/test/pm_matrix_tests.h"
  ;
  local_270 = "";
  local_288 = &boost::unit_test::basic_cstring<char_const>::null;
  local_280 = &boost::unit_test::basic_cstring<char_const>::null;
  boost::unit_test::unit_test_log_t::set_checkpoint
            (boost::unit_test::(anonymous_namespace)::unit_test_log,&local_278,0x581);
  local_478 = (char *)((ulong)local_478 & 0xffffffffffffff00);
  local_480 = &PTR__lazy_ostream_001f2110;
  local_470 = &boost::unit_test::lazy_ostream::inst;
  local_468 = "";
  local_4fc = 0;
  local_4a8[0] = *(int *)&p_Var4[1]._M_parent == 0;
  local_4f0 = (_Base_ptr)&p_Var4[1]._M_parent;
  local_4a0 = 0;
  sStack_498.pi_ = (sp_counted_base *)0x0;
  local_490 = 
  "/workspace/llm4binary/github/license_c_cmakelists/GUDHI[P]gudhi-devel/src/Persistence_matrix/test/pm_matrix_tests.h"
  ;
  local_488 = "";
  local_4c0[0] = local_4c0[0] & 0xffffff00;
  local_4c8 = &PTR__lazy_ostream_001f20d0;
  local_4b8 = &boost::unit_test::lazy_ostream::inst;
  local_4b0 = &local_4f0;
  local_4f8 = &local_4fc;
  local_4e0 = local_4e0 & 0xffffffffffffff00;
  local_4e8 = &PTR__lazy_ostream_001f20d0;
  sStack_4d8.pi_ = (sp_counted_base *)&boost::unit_test::lazy_ostream::inst;
  local_4d0 = &local_4f8;
  boost::test_tools::tt_detail::report_assertion();
  boost::detail::shared_count::~shared_count(&sStack_498);
  local_298 = 
  "/workspace/llm4binary/github/license_c_cmakelists/GUDHI[P]gudhi-devel/src/Persistence_matrix/test/pm_matrix_tests.h"
  ;
  local_290 = "";
  local_2a8 = &boost::unit_test::basic_cstring<char_const>::null;
  local_2a0 = &boost::unit_test::basic_cstring<char_const>::null;
  boost::unit_test::unit_test_log_t::set_checkpoint
            (boost::unit_test::(anonymous_namespace)::unit_test_log,&local_298,0x582);
  local_478 = (char *)((ulong)local_478 & 0xffffffffffffff00);
  local_480 = &PTR__lazy_ostream_001f2110;
  local_470 = &boost::unit_test::lazy_ostream::inst;
  local_468 = "";
  local_4fc = 7;
  local_4a8[0] = *(int *)&p_Var4[1].field_0x4 == 7;
  local_4f0 = (_Base_ptr)&p_Var4[1].field_0x4;
  local_4a0 = 0;
  sStack_498.pi_ = (sp_counted_base *)0x0;
  local_490 = 
  "/workspace/llm4binary/github/license_c_cmakelists/GUDHI[P]gudhi-devel/src/Persistence_matrix/test/pm_matrix_tests.h"
  ;
  local_488 = "";
  local_4c0[0] = local_4c0[0] & 0xffffff00;
  local_4c8 = &PTR__lazy_ostream_001f20d0;
  local_4b8 = &boost::unit_test::lazy_ostream::inst;
  local_4b0 = &local_4f0;
  local_4f8 = &local_4fc;
  local_4e0 = local_4e0 & 0xffffffffffffff00;
  local_4e8 = &PTR__lazy_ostream_001f20d0;
  sStack_4d8.pi_ = (sp_counted_base *)&boost::unit_test::lazy_ostream::inst;
  local_4d0 = &local_4f8;
  boost::test_tools::tt_detail::report_assertion();
  boost::detail::shared_count::~shared_count(&sStack_498);
  local_2b8 = 
  "/workspace/llm4binary/github/license_c_cmakelists/GUDHI[P]gudhi-devel/src/Persistence_matrix/test/pm_matrix_tests.h"
  ;
  local_2b0 = "";
  local_2c8 = &boost::unit_test::basic_cstring<char_const>::null;
  local_2c0 = &boost::unit_test::basic_cstring<char_const>::null;
  boost::unit_test::unit_test_log_t::set_checkpoint
            (boost::unit_test::(anonymous_namespace)::unit_test_log,&local_2b8,0x583);
  local_4f0 = p_Var4 + 1;
  local_478 = (char *)((ulong)local_478 & 0xffffffffffffff00);
  local_480 = &PTR__lazy_ostream_001f2110;
  local_470 = &boost::unit_test::lazy_ostream::inst;
  local_468 = "";
  local_4fc = 8;
  local_4a8[0] = local_4f0->_M_color == 8;
  local_4a0 = 0;
  sStack_498.pi_ = (sp_counted_base *)0x0;
  local_490 = 
  "/workspace/llm4binary/github/license_c_cmakelists/GUDHI[P]gudhi-devel/src/Persistence_matrix/test/pm_matrix_tests.h"
  ;
  local_488 = "";
  local_4c0[0] = local_4c0[0] & 0xffffff00;
  local_4c8 = &PTR__lazy_ostream_001f20d0;
  local_4b8 = &boost::unit_test::lazy_ostream::inst;
  local_4b0 = &local_4f0;
  local_4f8 = &local_4fc;
  local_4e0 = local_4e0 & 0xffffffffffffff00;
  local_4e8 = &PTR__lazy_ostream_001f20d0;
  sStack_4d8.pi_ = (sp_counted_base *)&boost::unit_test::lazy_ostream::inst;
  local_4d0 = &local_4f8;
  boost::test_tools::tt_detail::report_assertion();
  boost::detail::shared_count::~shared_count(&sStack_498);
  p_Var4 = (_Rb_tree_node_base *)std::_Rb_tree_increment(p_Var4);
  local_2d8 = 
  "/workspace/llm4binary/github/license_c_cmakelists/GUDHI[P]gudhi-devel/src/Persistence_matrix/test/pm_matrix_tests.h"
  ;
  local_2d0 = "";
  local_2e8 = &boost::unit_test::basic_cstring<char_const>::null;
  local_2e0 = &boost::unit_test::basic_cstring<char_const>::null;
  boost::unit_test::unit_test_log_t::set_checkpoint
            (boost::unit_test::(anonymous_namespace)::unit_test_log,&local_2d8,0x585);
  local_478 = (char *)((ulong)local_478 & 0xffffffffffffff00);
  local_480 = &PTR__lazy_ostream_001f2110;
  local_470 = &boost::unit_test::lazy_ostream::inst;
  local_468 = "";
  local_4fc = 1;
  local_4a8[0] = *(int *)&p_Var4[1]._M_parent == 1;
  local_4f0 = (_Base_ptr)&p_Var4[1]._M_parent;
  local_4a0 = 0;
  sStack_498.pi_ = (sp_counted_base *)0x0;
  local_490 = 
  "/workspace/llm4binary/github/license_c_cmakelists/GUDHI[P]gudhi-devel/src/Persistence_matrix/test/pm_matrix_tests.h"
  ;
  local_488 = "";
  local_4c0[0] = local_4c0[0] & 0xffffff00;
  local_4c8 = &PTR__lazy_ostream_001f20d0;
  local_4b8 = &boost::unit_test::lazy_ostream::inst;
  local_4b0 = &local_4f0;
  local_4f8 = &local_4fc;
  local_4e0 = local_4e0 & 0xffffffffffffff00;
  local_4e8 = &PTR__lazy_ostream_001f20d0;
  sStack_4d8.pi_ = (sp_counted_base *)&boost::unit_test::lazy_ostream::inst;
  local_4d0 = &local_4f8;
  boost::test_tools::tt_detail::report_assertion();
  boost::detail::shared_count::~shared_count(&sStack_498);
  local_2f8 = 
  "/workspace/llm4binary/github/license_c_cmakelists/GUDHI[P]gudhi-devel/src/Persistence_matrix/test/pm_matrix_tests.h"
  ;
  local_2f0 = "";
  local_308 = &boost::unit_test::basic_cstring<char_const>::null;
  local_300 = &boost::unit_test::basic_cstring<char_const>::null;
  boost::unit_test::unit_test_log_t::set_checkpoint
            (boost::unit_test::(anonymous_namespace)::unit_test_log,&local_2f8,0x586);
  local_478 = (char *)((ulong)local_478 & 0xffffffffffffff00);
  local_480 = &PTR__lazy_ostream_001f2110;
  local_470 = &boost::unit_test::lazy_ostream::inst;
  local_468 = "";
  local_4fc = 5;
  local_4a8[0] = *(int *)&p_Var4[1].field_0x4 == 5;
  local_4f0 = (_Base_ptr)&p_Var4[1].field_0x4;
  local_4a0 = 0;
  sStack_498.pi_ = (sp_counted_base *)0x0;
  local_490 = 
  "/workspace/llm4binary/github/license_c_cmakelists/GUDHI[P]gudhi-devel/src/Persistence_matrix/test/pm_matrix_tests.h"
  ;
  local_488 = "";
  local_4c0[0] = local_4c0[0] & 0xffffff00;
  local_4c8 = &PTR__lazy_ostream_001f20d0;
  local_4b8 = &boost::unit_test::lazy_ostream::inst;
  local_4b0 = &local_4f0;
  local_4f8 = &local_4fc;
  local_4e0 = local_4e0 & 0xffffffffffffff00;
  local_4e8 = &PTR__lazy_ostream_001f20d0;
  sStack_4d8.pi_ = (sp_counted_base *)&boost::unit_test::lazy_ostream::inst;
  local_4d0 = &local_4f8;
  boost::test_tools::tt_detail::report_assertion();
  boost::detail::shared_count::~shared_count(&sStack_498);
  local_318 = 
  "/workspace/llm4binary/github/license_c_cmakelists/GUDHI[P]gudhi-devel/src/Persistence_matrix/test/pm_matrix_tests.h"
  ;
  local_310 = "";
  local_328 = &boost::unit_test::basic_cstring<char_const>::null;
  local_320 = &boost::unit_test::basic_cstring<char_const>::null;
  boost::unit_test::unit_test_log_t::set_checkpoint
            (boost::unit_test::(anonymous_namespace)::unit_test_log,&local_318,0x587);
  local_4f0 = p_Var4 + 1;
  local_478 = (char *)((ulong)local_478 & 0xffffffffffffff00);
  local_480 = &PTR__lazy_ostream_001f2110;
  local_470 = &boost::unit_test::lazy_ostream::inst;
  local_468 = "";
  local_4fc = 6;
  local_4a8[0] = local_4f0->_M_color == 6;
  local_4a0 = 0;
  sStack_498.pi_ = (sp_counted_base *)0x0;
  local_490 = 
  "/workspace/llm4binary/github/license_c_cmakelists/GUDHI[P]gudhi-devel/src/Persistence_matrix/test/pm_matrix_tests.h"
  ;
  local_488 = "";
  local_4c0[0] = local_4c0[0] & 0xffffff00;
  local_4c8 = &PTR__lazy_ostream_001f20d0;
  local_4b8 = &boost::unit_test::lazy_ostream::inst;
  local_4b0 = &local_4f0;
  local_4f8 = &local_4fc;
  local_4e0 = local_4e0 & 0xffffffffffffff00;
  local_4e8 = &PTR__lazy_ostream_001f20d0;
  sStack_4d8.pi_ = (sp_counted_base *)&boost::unit_test::lazy_ostream::inst;
  local_4d0 = &local_4f8;
  boost::test_tools::tt_detail::report_assertion
            (local_4a8,&local_480,&local_490,0x587,1,2,2,"std::get<2>(*it)",&local_4c8,"6",
             &local_4e8);
  boost::detail::shared_count::~shared_count(&sStack_498);
  puVar5 = (undefined1 *)std::_Rb_tree_increment(p_Var4);
  local_338 = 
  "/workspace/llm4binary/github/license_c_cmakelists/GUDHI[P]gudhi-devel/src/Persistence_matrix/test/pm_matrix_tests.h"
  ;
  local_330 = "";
  local_348 = &boost::unit_test::basic_cstring<char_const>::null;
  local_340 = &boost::unit_test::basic_cstring<char_const>::null;
  boost::unit_test::unit_test_log_t::set_checkpoint
            (boost::unit_test::(anonymous_namespace)::unit_test_log,&local_338,0x589);
  local_4e8 = (undefined **)
              CONCAT71(local_4e8._1_7_,
                       (_Rb_tree_header *)puVar5 == &bars1._M_t._M_impl.super__Rb_tree_header);
  local_4e0 = 0;
  sStack_4d8.pi_ = (sp_counted_base *)0x0;
  local_480 = (undefined **)0x1c15c4;
  local_478 = "";
  local_4c0[0] = local_4c0[0] & 0xffffff00;
  local_4c8 = &PTR__lazy_ostream_001f2250;
  local_4b8 = &boost::unit_test::lazy_ostream::inst;
  local_358 = 
  "/workspace/llm4binary/github/license_c_cmakelists/GUDHI[P]gudhi-devel/src/Persistence_matrix/test/pm_matrix_tests.h"
  ;
  local_350 = "";
  local_4b0 = (_Base_ptr *)&local_480;
  boost::test_tools::tt_detail::report_assertion();
  boost::detail::shared_count::~shared_count(&sStack_4d8);
  local_368 = 
  "/workspace/llm4binary/github/license_c_cmakelists/GUDHI[P]gudhi-devel/src/Persistence_matrix/test/pm_matrix_tests.h"
  ;
  local_360 = "";
  local_378 = &boost::unit_test::basic_cstring<char_const>::null;
  local_370 = &boost::unit_test::basic_cstring<char_const>::null;
  boost::unit_test::unit_test_log_t::set_checkpoint
            (boost::unit_test::(anonymous_namespace)::unit_test_log,&local_368,0x58b);
  if (bars1._M_t._M_impl.super__Rb_tree_header._M_node_count ==
      bars2._M_t._M_impl.super__Rb_tree_header._M_node_count) {
    bVar3 = std::__equal<false>::
            equal<std::_Rb_tree_const_iterator<std::tuple<int,int,int>>,std::_Rb_tree_const_iterator<std::tuple<int,int,int>>>
                      ((_Rb_tree_const_iterator<std::tuple<int,_int,_int>_>)
                       bars1._M_t._M_impl.super__Rb_tree_header._M_header._M_left,
                       (_Rb_tree_const_iterator<std::tuple<int,_int,_int>_>)
                       &bars1._M_t._M_impl.super__Rb_tree_header,
                       (_Rb_tree_const_iterator<std::tuple<int,_int,_int>_>)
                       bars2._M_t._M_impl.super__Rb_tree_header._M_header._M_left);
  }
  else {
    bVar3 = false;
  }
  local_4e8 = (undefined **)CONCAT71(local_4e8._1_7_,bVar3);
  local_4e0 = 0;
  sStack_4d8.pi_ = (sp_counted_base *)0x0;
  local_480 = (undefined **)0x1c15d6;
  local_478 = "";
  local_4c0[0] = local_4c0[0] & 0xffffff00;
  local_4c8 = &PTR__lazy_ostream_001f2250;
  local_4b8 = &boost::unit_test::lazy_ostream::inst;
  local_388 = 
  "/workspace/llm4binary/github/license_c_cmakelists/GUDHI[P]gudhi-devel/src/Persistence_matrix/test/pm_matrix_tests.h"
  ;
  local_380 = "";
  local_4b0 = (_Base_ptr *)&local_480;
  boost::test_tools::tt_detail::report_assertion();
  boost::detail::shared_count::~shared_count(&sStack_4d8);
  local_398 = 
  "/workspace/llm4binary/github/license_c_cmakelists/GUDHI[P]gudhi-devel/src/Persistence_matrix/test/pm_matrix_tests.h"
  ;
  local_390 = "";
  boost::unit_test::unit_test_log_t::set_checkpoint
            (boost::unit_test::(anonymous_namespace)::unit_test_log,&local_398,0x58c);
  if (bars1._M_t._M_impl.super__Rb_tree_header._M_node_count ==
      bars3._M_t._M_impl.super__Rb_tree_header._M_node_count) {
    bVar3 = std::__equal<false>::
            equal<std::_Rb_tree_const_iterator<std::tuple<int,int,int>>,std::_Rb_tree_const_iterator<std::tuple<int,int,int>>>
                      ((_Rb_tree_const_iterator<std::tuple<int,_int,_int>_>)
                       bars1._M_t._M_impl.super__Rb_tree_header._M_header._M_left,
                       (_Rb_tree_const_iterator<std::tuple<int,_int,_int>_>)
                       &bars1._M_t._M_impl.super__Rb_tree_header,
                       (_Rb_tree_const_iterator<std::tuple<int,_int,_int>_>)
                       bars3._M_t._M_impl.super__Rb_tree_header._M_header._M_left);
  }
  else {
    bVar3 = false;
  }
  local_4e8 = (undefined **)CONCAT71(local_4e8._1_7_,bVar3);
  local_4e0 = 0;
  sStack_4d8.pi_ = (sp_counted_base *)0x0;
  local_480 = (undefined **)0x1c15e5;
  local_478 = "";
  local_4c0[0] = local_4c0[0] & 0xffffff00;
  local_4c8 = &PTR__lazy_ostream_001f2250;
  local_4b8 = &boost::unit_test::lazy_ostream::inst;
  local_4b0 = (_Base_ptr *)&local_480;
  boost::test_tools::tt_detail::report_assertion();
  boost::detail::shared_count::~shared_count(&sStack_4d8);
  std::
  _Rb_tree<std::tuple<int,_int,_int>,_std::tuple<int,_int,_int>,_std::_Identity<std::tuple<int,_int,_int>_>,_BarComp,_std::allocator<std::tuple<int,_int,_int>_>_>
  ::~_Rb_tree(&bars3._M_t);
  std::
  _Rb_tree<std::tuple<int,_int,_int>,_std::tuple<int,_int,_int>,_std::_Identity<std::tuple<int,_int,_int>_>,_BarComp,_std::allocator<std::tuple<int,_int,_int>_>_>
  ::~_Rb_tree(&bars2._M_t);
  std::
  _Rb_tree<std::tuple<int,_int,_int>,_std::tuple<int,_int,_int>,_std::_Identity<std::tuple<int,_int,_int>_>,_BarComp,_std::allocator<std::tuple<int,_int,_int>_>_>
  ::~_Rb_tree(&bars1._M_t);
  Gudhi::persistence_matrix::
  Matrix<Boundary_options<true,_(Gudhi::persistence_matrix::Column_types)7,_false,_false,_true>_>::
  ~Matrix(&m);
  std::
  vector<std::vector<unsigned_int,_std::allocator<unsigned_int>_>,_std::allocator<std::vector<unsigned_int,_std::allocator<unsigned_int>_>_>_>
  ::~vector(&columns);
  return;
}

Assistant:

void test_barcode() {
  struct BarComp {
    bool operator()(const std::tuple<int, int, int>& c1, const std::tuple<int, int, int>& c2) const {
      if (std::get<0>(c1) != std::get<0>(c2)) return std::get<0>(c1) < std::get<0>(c2);
      if (std::get<1>(c1) != std::get<1>(c2)) return std::get<1>(c1) < std::get<1>(c2);
      return std::get<2>(c1) < std::get<2>(c2);
    }
  };

  auto columns = build_longer_boundary_matrix<typename Matrix::Column>();
  Matrix m(columns, 5);

  const auto& barcode = m.get_current_barcode();

  if constexpr (Matrix::Option_list::is_of_boundary_type) {
    columns[5].clear();
  } else {
    columns = build_longer_chain_matrix<typename Matrix::Column>();
  }
  test_content_equality(columns, m);

  if constexpr (Matrix::Option_list::has_row_access) {
    std::vector<witness_content<typename Matrix::Column> > rows;
    if constexpr (Matrix::Option_list::is_of_boundary_type) {
      rows = build_longer_reduced_row_matrix<typename Matrix::Column>();
    } else {
      rows = build_longer_chain_row_matrix<typename Matrix::Column>();
    }
    unsigned int i = 0;
    for (auto& r : rows) {
      if constexpr (Matrix::Option_list::has_removable_rows)
        if (i == 6) continue;
      test_column_equality<typename Matrix::Column>(r, get_ordered_row(m, i++));
    }
  }

  std::set<std::tuple<int, int, int>, BarComp> bars1;
  std::set<std::tuple<int, int, int>, BarComp> bars2;
  std::set<std::tuple<int, int, int>, BarComp> bars3;
  // bars are not ordered the same for all matrices
  for (auto it = barcode.begin(); it != barcode.end(); ++it) {
    // three access possibilities
    bars1.emplace(it->dim, it->birth, it->death);
    bars2.emplace(std::get<2>(*it), std::get<0>(*it), std::get<1>(*it));
    auto [x, y, z] = *it;
    bars3.emplace(z, x, y);
  }
  auto it = bars1.begin();
  BOOST_CHECK_EQUAL(std::get<0>(*it), 0);
  BOOST_CHECK_EQUAL(std::get<1>(*it), 0);
  // TODO: verify why this -1 works...: it->death should be unsigned int, so double conversion
  BOOST_CHECK_EQUAL(std::get<2>(*it), -1);
  ++it;
  BOOST_CHECK_EQUAL(std::get<0>(*it), 0);
  BOOST_CHECK_EQUAL(std::get<1>(*it), 1);
  BOOST_CHECK_EQUAL(std::get<2>(*it), 3);
  ++it;
  BOOST_CHECK_EQUAL(std::get<0>(*it), 0);
  BOOST_CHECK_EQUAL(std::get<1>(*it), 2);
  BOOST_CHECK_EQUAL(std::get<2>(*it), 4);
  ++it;
  BOOST_CHECK_EQUAL(std::get<0>(*it), 0);
  BOOST_CHECK_EQUAL(std::get<1>(*it), 7);
  BOOST_CHECK_EQUAL(std::get<2>(*it), 8);
  ++it;
  BOOST_CHECK_EQUAL(std::get<0>(*it), 1);
  BOOST_CHECK_EQUAL(std::get<1>(*it), 5);
  BOOST_CHECK_EQUAL(std::get<2>(*it), 6);
  ++it;
  BOOST_CHECK(it == bars1.end());

  BOOST_CHECK(bars1 == bars2);
  BOOST_CHECK(bars1 == bars3);
}